

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O1

void __thiscall
Eigen::
GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>
::GeneralProduct(GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3>
                 *this,GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>
                       *lhs,Matrix<double,__1,_1,_0,__1,_1> *rhs)

{
  long lVar1;
  double dVar2;
  scalar_sum_op<double> local_29;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_28;
  
  local_28.m_lhs.m_matrix = ProductBase::operator_cast_to_Matrix_((ProductBase *)lhs);
  lVar1 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_28.m_rhs = rhs;
  if (((local_28.m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
      m_storage.m_cols == lVar1) {
    if (lVar1 == 0) {
      dVar2 = 0.0;
    }
    else {
      dVar2 = internal::
              redux_impl<Eigen::internal::scalar_sum_op<double>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_3,_0>
              ::run(&local_28,&local_29);
    }
    (this->super_Matrix<double,_1,_1,_0,_1,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] = dVar2;
    return;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chrisgundling[P]Udacity-T2P2-UnscentedKalmanFilter/src/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x84,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double, -1, -1>>>, 4>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Transpose<const Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double, -1, -1>>>, 4>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

GeneralProduct(const Lhs& lhs, const Rhs& rhs)
    {
      Base::coeffRef(0,0) = (lhs.transpose().cwiseProduct(rhs)).sum();
    }